

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void __thiscall
duckdb::StandardColumnWriter<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>::
Analyze(StandardColumnWriter<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>
        *this,ColumnWriterState *state_p,ColumnWriterState *parent,Vector *vector,idx_t count)

{
  string_t value;
  string_t value_00;
  bool bVar1;
  byte bVar2;
  StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>
  *pSVar3;
  size_type sVar4;
  ValidityMask *this_00;
  idx_t iVar5;
  long in_RDX;
  TemplatedValidityMask<unsigned_long> *in_R8;
  string_t *src_value_1;
  idx_t i;
  string_t *src_value;
  ValidityMask *validity;
  idx_t vcount;
  idx_t parent_index;
  bool check_parent_empty;
  idx_t vector_index;
  string_t *data_ptr;
  StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>
  *state;
  uint7 in_stack_ffffffffffffff38;
  PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>
  *in_stack_ffffffffffffff40;
  TemplatedValidityMask<unsigned_long> *this_01;
  undefined7 in_stack_ffffffffffffff50;
  byte bVar6;
  reference local_90;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff80;
  TemplatedValidityMask<unsigned_long> *pTVar7;
  TemplatedValidityMask<unsigned_long> *local_40;
  
  pSVar3 = ColumnWriterState::
           Cast<duckdb::StandardColumnWriterState<duckdb::string_t,duckdb::string_t,duckdb::ParquetStringOperator>>
                     ((ColumnWriterState *)in_stack_ffffffffffffff40);
  FlatVector::GetData<duckdb::string_t>((Vector *)0x5b69d1);
  local_40 = (TemplatedValidityMask<unsigned_long> *)0x0;
  bVar6 = 0;
  if (in_RDX != 0) {
    bVar1 = std::vector<bool,_std::allocator<bool>_>::empty(in_stack_ffffffffffffff80);
    bVar6 = bVar1 ^ 0xff;
  }
  bVar2 = bVar6 & 1;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
            (&(pSVar3->super_PrimitiveColumnWriterState).super_ColumnWriterState.definition_levels.
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>);
  if (bVar2 != 0) {
    in_stack_ffffffffffffff40 =
         (PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator> *)
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDX + 8));
    sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                      (&(pSVar3->super_PrimitiveColumnWriterState).super_ColumnWriterState.
                        definition_levels.
                        super_vector<unsigned_short,_std::allocator<unsigned_short>_>);
    in_R8 = (TemplatedValidityMask<unsigned_long> *)((long)in_stack_ffffffffffffff40 - sVar4);
  }
  this_01 = in_R8;
  this_00 = FlatVector::Validity((Vector *)0x5b6a97);
  if ((bVar2 == 0) &&
     (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                        ((TemplatedValidityMask<unsigned_long> *)this_00), bVar1)) {
    for (; local_40 < in_R8; local_40 = local_40 + 1) {
      value.value._8_7_ = in_stack_ffffffffffffff50;
      value.value._0_8_ = this_01;
      value.value.inlined.inlined[0xb] = bVar6;
      PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>::Insert
                (in_stack_ffffffffffffff40,value);
      pSVar3->total_value_count = pSVar3->total_value_count + 1;
      iVar5 = DlbaEncoder::GetStringSize<duckdb::string_t>((string_t *)0x5b6b46);
      pSVar3->total_string_size = iVar5 + pSVar3->total_string_size;
    }
  }
  else {
    for (pTVar7 = (TemplatedValidityMask<unsigned_long> *)0x0; pTVar7 < in_R8; pTVar7 = pTVar7 + 1)
    {
      bVar1 = false;
      if (bVar2 != 0) {
        local_90 = vector<bool,_true>::operator[]
                             ((vector<bool,_true> *)in_stack_ffffffffffffff40,
                              (ulong)in_stack_ffffffffffffff38);
        bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_90);
      }
      if ((bVar1 == false) &&
         (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (this_01,(idx_t)in_stack_ffffffffffffff40), bVar1)) {
        value_00.value._8_7_ = in_stack_ffffffffffffff50;
        value_00.value._0_8_ = this_01;
        value_00.value.inlined.inlined[0xb] = bVar6;
        PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>::
        Insert(in_stack_ffffffffffffff40,value_00);
        pSVar3->total_value_count = pSVar3->total_value_count + 1;
        iVar5 = DlbaEncoder::GetStringSize<duckdb::string_t>((string_t *)0x5b6c77);
        pSVar3->total_string_size = iVar5 + pSVar3->total_string_size;
      }
    }
  }
  return;
}

Assistant:

void Analyze(ColumnWriterState &state_p, ColumnWriterState *parent, Vector &vector, idx_t count) override {
		auto &state = state_p.Cast<StandardColumnWriterState<SRC, TGT, OP>>();

		auto data_ptr = FlatVector::GetData<SRC>(vector);
		idx_t vector_index = 0;

		const bool check_parent_empty = parent && !parent->is_empty.empty();
		const idx_t parent_index = state.definition_levels.size();

		const idx_t vcount =
		    check_parent_empty ? parent->definition_levels.size() - state.definition_levels.size() : count;

		const auto &validity = FlatVector::Validity(vector);

		if (!check_parent_empty && validity.AllValid()) {
			// Fast path
			for (; vector_index < vcount; vector_index++) {
				const auto &src_value = data_ptr[vector_index];
				state.dictionary.Insert(src_value);
				state.total_value_count++;
				state.total_string_size += DlbaEncoder::GetStringSize(src_value);
			}
		} else {
			for (idx_t i = 0; i < vcount; i++) {
				if (check_parent_empty && parent->is_empty[parent_index + i]) {
					continue;
				}
				if (validity.RowIsValid(vector_index)) {
					const auto &src_value = data_ptr[vector_index];
					state.dictionary.Insert(src_value);
					state.total_value_count++;
					state.total_string_size += DlbaEncoder::GetStringSize(src_value);
				}
				vector_index++;
			}
		}
	}